

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O0

void StoreStats(VP8Encoder *enc)

{
  undefined4 *puVar1;
  long in_RDI;
  int s;
  int i;
  WebPAuxStats *stats;
  int local_18;
  int local_14;
  
  puVar1 = *(undefined4 **)(*(long *)(in_RDI + 8) + 0x80);
  if (puVar1 != (undefined4 *)0x0) {
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      puVar1[(long)local_14 + 0x1f] = *(undefined4 *)(in_RDI + (long)local_14 * 0x2e8 + 0x50c);
      puVar1[(long)local_14 + 0x1b] = *(undefined4 *)(in_RDI + (long)local_14 * 0x2e8 + 0x508);
      for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
        puVar1[(long)local_18 * 4 + (long)local_14 + 0xb] =
             *(undefined4 *)(in_RDI + 0x5c04 + (long)local_18 * 0x10 + (long)local_14 * 4);
      }
    }
    FinalizePSNR(_s);
    *puVar1 = *(undefined4 *)(in_RDI + 0x5c00);
    for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
      puVar1[(long)local_14 + 6] = *(undefined4 *)(in_RDI + 0x5c34 + (long)local_14 * 4);
    }
  }
  return;
}

Assistant:

static void StoreStats(VP8Encoder* const enc) {
#if !defined(WEBP_DISABLE_STATS)
  WebPAuxStats* const stats = enc->pic->stats;
  if (stats != NULL) {
    int i, s;
    for (i = 0; i < NUM_MB_SEGMENTS; ++i) {
      stats->segment_level[i] = enc->dqm[i].fstrength;
      stats->segment_quant[i] = enc->dqm[i].quant;
      for (s = 0; s <= 2; ++s) {
        stats->residual_bytes[s][i] = enc->residual_bytes[s][i];
      }
    }
    FinalizePSNR(enc);
    stats->coded_size = enc->coded_size;
    for (i = 0; i < 3; ++i) {
      stats->block_count[i] = enc->block_count[i];
    }
  }
#else  // defined(WEBP_DISABLE_STATS)
  WebPReportProgress(enc->pic, 100, &enc->percent);  // done!
#endif  // !defined(WEBP_DISABLE_STATS)
}